

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::loadObject
               (NameIdPool<xercesc_4_0::XMLNotationDecl> **objToLoad,int initSize,int initSize2,
               XSerializeEngine *serEng)

{
  bool bVar1;
  uint in_EAX;
  MemoryManager *pMVar2;
  NameIdPool<xercesc_4_0::XMLNotationDecl> *this;
  XMLNotationDecl *this_00;
  uint uVar3;
  XMLSize_t hashModulus;
  uint itemNumber;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    this = *objToLoad;
    if (this == (NameIdPool<xercesc_4_0::XMLNotationDecl> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (NameIdPool<xercesc_4_0::XMLNotationDecl> *)XMemory::operator_new(0x58,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      hashModulus = 0x10;
      if (-1 < initSize) {
        hashModulus = (ulong)(uint)initSize;
      }
      NameIdPool<xercesc_4_0::XMLNotationDecl>::NameIdPool(this,hashModulus,(long)initSize2,pMVar2);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    uStack_38 = (ulong)(uint)uStack_38;
    XSerializeEngine::operator>>(serEng,(uint *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ != 0) {
      uVar3 = 0;
      do {
        pMVar2 = XSerializeEngine::getMemoryManager(serEng);
        this_00 = (XMLNotationDecl *)XMemory::operator_new(0x40,pMVar2);
        pMVar2 = XSerializeEngine::getMemoryManager(serEng);
        XMLNotationDecl::XMLNotationDecl(this_00,pMVar2);
        (*(this_00->super_XSerializable)._vptr_XSerializable[3])(this_00,serEng);
        NameIdPool<xercesc_4_0::XMLNotationDecl>::put(*objToLoad,this_00);
        uVar3 = uVar3 + 1;
      } while (uVar3 < uStack_38._4_4_);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(NameIdPool<XMLNotationDecl>** objToLoad
                                   , int                          initSize
                                   , int                          initSize2
                                   , XSerializeEngine&            serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             NameIdPool<XMLNotationDecl>(
                                                         initSize
                                                       , initSize2
                                                       , serEng.getMemoryManager()
                                                       );
        }

        serEng.registerObject(*objToLoad);

        unsigned int itemNumber = 0;
        serEng >> itemNumber;

        for (unsigned int itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XMLNotationDecl*  data = new (serEng.getMemoryManager())
                                     XMLNotationDecl(serEng.getMemoryManager());
            data->serialize(serEng);
            (*objToLoad)->put(data);
        }
    }
}